

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

string_stream * __thiscall
argh::parser::operator()
          (string_stream *__return_storage_ptr__,parser *this,
          initializer_list<const_char_*const> init_list,double *def_val)

{
  string_stream *psVar1;
  const_iterator cVar2;
  long lVar3;
  ostringstream ostr;
  allocator local_1f1;
  string_stream *local_1f0;
  double *local_1e8;
  _Base_ptr local_1e0;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d8;
  iterator local_1d0;
  string local_1c8;
  string local_1a8 [11];
  
  local_1d0 = init_list._M_array;
  local_1d8 = &this->params_;
  local_1e0 = &(this->params_)._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar3 = 0;
  local_1f0 = __return_storage_ptr__;
  local_1e8 = def_val;
  do {
    if (init_list._M_len << 3 == lVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      *(undefined8 *)
       ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
           0x15;
      std::ostream::_M_insert<double>(*local_1e8);
      std::__cxx11::stringbuf::str();
      psVar1 = local_1f0;
      stringstream_proxy::stringstream_proxy(local_1f0,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      return psVar1;
    }
    std::__cxx11::string::string
              ((string *)&local_1c8,*(char **)((long)local_1d0 + lVar3),&local_1f1);
    trim_leading_dashes(local_1a8,this,&local_1c8);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_1d8->_M_t,local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    psVar1 = local_1f0;
    lVar3 = lVar3 + 8;
  } while (local_1e0 == cVar2._M_node);
  stringstream_proxy::stringstream_proxy(local_1f0,(string *)(cVar2._M_node + 2));
  return psVar1;
}

Assistant:

string_stream parser::operator()(std::initializer_list<char const* const> init_list, T&& def_val) const
   {
      for (auto& name : init_list)
      {
         auto optIt = params_.find(trim_leading_dashes(name));
         if (params_.end() != optIt)
            return string_stream(optIt->second);
      }
      std::ostringstream ostr;
      ostr.precision(std::numeric_limits<long double>::max_digits10);
      ostr << def_val;
      return string_stream(ostr.str()); // use default
   }